

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.h
# Opt level: O2

void __thiscall
cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
          (cmGeneratorExpressionInterpreter *this,cmLocalGenerator *localGenerator,string *config,
          cmGeneratorTarget *headTarget,string *language)

{
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_48;
  
  local_48.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_48.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_48);
  cmGeneratorExpression::cmGeneratorExpression
            (&this->GeneratorExpression,(cmListFileBacktrace *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  (this->CompiledGeneratorExpression)._M_t.
  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
       (cmCompiledGeneratorExpression *)0x0;
  this->LocalGenerator = localGenerator;
  std::__cxx11::string::string((string *)&this->Config,(string *)config);
  this->HeadTarget = headTarget;
  std::__cxx11::string::string((string *)&this->Language,(string *)language);
  return;
}

Assistant:

cmGeneratorExpressionInterpreter(cmLocalGenerator* localGenerator,
                                   std::string config,
                                   cmGeneratorTarget const* headTarget,
                                   std::string language = std::string())
    : LocalGenerator(localGenerator)
    , Config(std::move(config))
    , HeadTarget(headTarget)
    , Language(std::move(language))
  {
  }